

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeSetSpillSize(Btree *p,int mxPage)

{
  int *piVar1;
  int iVar2;
  BtShared *pBVar3;
  PCache *pPVar4;
  int iVar5;
  
  pBVar3 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pPVar4 = pBVar3->pPager->pPCache;
  if (mxPage != 0) {
    if (mxPage < 0) {
      mxPage = (int)(((long)mxPage * -0x400) / ((long)pPVar4->szExtra + (long)pPVar4->szPage));
    }
    pPVar4->szSpill = mxPage;
  }
  iVar5 = pPVar4->szCache;
  if ((long)iVar5 < 0) {
    iVar5 = (int)(((long)iVar5 * -0x400) / ((long)pPVar4->szExtra + (long)pPVar4->szPage));
  }
  iVar2 = pPVar4->szSpill;
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  if (iVar2 < iVar5) {
    iVar2 = iVar5;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetSpillSize(Btree *p, int mxPage){
  BtShared *pBt = p->pBt;
  int res;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  res = sqlite3PagerSetSpillsize(pBt->pPager, mxPage);
  sqlite3BtreeLeave(p);
  return res;
}